

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O2

Vec_Int_t * Acec_InsertTree(Gia_Man_t *pNew,Vec_Wec_t *vLeafMap)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int i;
  int Out [2];
  int In [3];
  
  iVar1 = vLeafMap->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 + 4U) {
    iVar4 = iVar1 + 5;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  i = 0;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  do {
    if (iVar1 <= i) {
      return p;
    }
    pVVar3 = Vec_WecEntry(vLeafMap,i);
    iVar1 = pVVar3->nSize;
    if (iVar1 == 0) {
      Vec_IntPush(p,0);
    }
    else {
      while (1 < iVar1) {
        if (iVar1 == 2) {
          Vec_IntPush(pVVar3,0);
        }
        iVar1 = 0;
        In[0] = Vec_IntEntry(pVVar3,0);
        Vec_IntDrop(pVVar3,iVar1);
        iVar1 = 0;
        In[1] = Vec_IntEntry(pVVar3,0);
        Vec_IntDrop(pVVar3,iVar1);
        iVar1 = 0;
        In[2] = Vec_IntEntry(pVVar3,0);
        Vec_IntDrop(pVVar3,iVar1);
        Acec_InsertFadd(pNew,In,Out);
        Vec_IntPush(pVVar3,Out[0]);
        if (i + 1 < vLeafMap->nSize) {
          pVVar3 = Vec_WecEntry(vLeafMap,i + 1);
        }
        else {
          pVVar3 = Vec_WecPushLevel(vLeafMap);
        }
        Vec_IntPush(pVVar3,Out[1]);
        pVVar3 = Vec_WecEntry(vLeafMap,i);
        iVar1 = pVVar3->nSize;
      }
      if (iVar1 != 1) {
        __assert_fail("Vec_IntSize(vLevel) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                      ,0x65,"Vec_Int_t *Acec_InsertTree(Gia_Man_t *, Vec_Wec_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar3,0);
      Vec_IntPush(p,iVar1);
    }
    i = i + 1;
    iVar1 = vLeafMap->nSize;
  } while( true );
}

Assistant:

Vec_Int_t * Acec_InsertTree( Gia_Man_t * pNew, Vec_Wec_t * vLeafMap )
{
    Vec_Int_t * vRootRanks = Vec_IntAlloc( Vec_WecSize(vLeafMap) + 5 );
    Vec_Int_t * vLevel;
    int i, In[3], Out[2];
    Vec_WecForEachLevel( vLeafMap, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) == 0 )
        {
            Vec_IntPush( vRootRanks, 0 );
            continue;
        }
        while ( Vec_IntSize(vLevel) > 1 )
        {
            if ( Vec_IntSize(vLevel) == 2 )
                Vec_IntPush( vLevel, 0 );
            //In[2] = Vec_IntPop( vLevel );
            //In[1] = Vec_IntPop( vLevel );
            //In[0] = Vec_IntPop( vLevel );

            In[0] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            In[1] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            In[2] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            Acec_InsertFadd( pNew, In, Out );
            Vec_IntPush( vLevel, Out[0] );
            if ( i+1 < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i+1);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, Out[1] );
            vLevel = Vec_WecEntry(vLeafMap, i);
        }
        assert( Vec_IntSize(vLevel) == 1 );
        Vec_IntPush( vRootRanks, Vec_IntEntry(vLevel, 0) );
    }
    return vRootRanks;
}